

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall
QCompletionEngine::saveInCache
          (QCompletionEngine *this,QString part,QModelIndex *parent,QMatchData *m)

{
  _Base_ptr *this_00;
  Cache *this_01;
  long lVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  QMap<QString,_QMatchData> *pQVar6;
  iterator it;
  iterator iVar7;
  iterator it_00;
  iterator iVar8;
  QMatchData *this_02;
  QMatchData *in_RCX;
  int iVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QMatchData old;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->c->filterMode).super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
      super_QFlagsStorage<Qt::MatchFlag>.i != 3) {
    old.indices._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    old._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    old.indices.vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    old.indices.vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    old.indices._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    old.indices.vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = &this->cache;
    pQVar6 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[](this_01,(QModelIndex *)m);
    QMap<QString,_QMatchData>::take(&old,pQVar6,(QString *)parent);
    iVar5 = (this->cost + (int)(in_RCX->indices).vector.d.size) - (int)old.indices.vector.d.size;
    this->cost = iVar5;
    if (0x100000 < (ulong)((long)iVar5 << 2)) {
      it._M_node = (_Base_ptr)QMap<QModelIndex,_QMap<QString,_QMatchData>_>::begin(this_01);
      while( true ) {
        iVar7 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::end(this_01);
        if ((iterator)it._M_node == iVar7.i._M_node) break;
        iVar9 = 0;
        iVar5 = 0;
        if (it._M_node[1]._M_right != (_Base_ptr)0x0) {
          iVar5 = (int)((long)it._M_node[1]._M_right[1]._M_left / 2);
        }
        this_00 = &it._M_node[1]._M_right;
        it_00._M_node =
             (_Base_ptr)QMap<QString,_QMatchData>::begin((QMap<QString,_QMatchData> *)this_00);
        while( true ) {
          iVar8 = QMap<QString,_QMatchData>::end((QMap<QString,_QMatchData> *)this_00);
          if (((iterator)it_00._M_node == iVar8.i._M_node) || (iVar5 <= iVar9)) break;
          this->cost = (this->cost - *(int *)&it_00._M_node[2]._M_left) + -2;
          it_00._M_node =
               (_Base_ptr)
               QMap<QString,_QMatchData>::erase((QMap<QString,_QMatchData> *)this_00,it_00._M_node);
          iVar9 = iVar9 + 1;
        }
        if ((*this_00 == (_Base_ptr)0x0) || ((*this_00)[1]._M_left == (_Base_ptr)0x0)) {
          it._M_node = (_Base_ptr)
                       QMap<QModelIndex,_QMap<QString,_QMatchData>_>::erase(this_01,it._M_node);
        }
        else {
          it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
        }
      }
    }
    if (this->c->cs == CaseInsensitive) {
      QString::toLower_helper((QString *)&local_88);
      pDVar3 = *(Data **)parent;
      pcVar4 = (char16_t *)parent->i;
      *(Data **)parent = local_88.d;
      parent->i = (quintptr)local_88.ptr;
      pQVar2 = (parent->m).ptr;
      (parent->m).ptr = (QAbstractItemModel *)local_88.size;
      local_88.d = pDVar3;
      local_88.ptr = pcVar4;
      local_88.size = (qsizetype)pQVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    pQVar6 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[](this_01,(QModelIndex *)m);
    this_02 = QMap<QString,_QMatchData>::operator[](pQVar6,(QString *)parent);
    QMatchData::operator=(this_02,in_RCX);
    QArrayDataPointer<int>::~QArrayDataPointer(&old.indices.vector.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompletionEngine::saveInCache(QString part, const QModelIndex& parent, const QMatchData& m)
{
    if (c->filterMode == Qt::MatchEndsWith)
        return;
    QMatchData old = cache[parent].take(part);
    cost = cost + m.indices.cost() - old.indices.cost();
    if (cost * sizeof(int) > 1024 * 1024) {
        QMap<QModelIndex, CacheItem>::iterator it1 = cache.begin();
        while (it1 != cache.end()) {
            CacheItem& ci = it1.value();
            int sz = ci.size()/2;
            QMap<QString, QMatchData>::iterator it2 = ci.begin();
            int i = 0;
            while (it2 != ci.end() && i < sz) {
                cost -= it2.value().indices.cost();
                it2 = ci.erase(it2);
                i++;
            }
            if (ci.size() == 0) {
              it1 = cache.erase(it1);
            } else {
              ++it1;
            }
        }
    }

    if (c->cs == Qt::CaseInsensitive)
        part = std::move(part).toLower();
    cache[parent][part] = m;
}